

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O0

void __thiscall Stereo_Buffer::Stereo_Buffer(Stereo_Buffer *this)

{
  Multi_Buffer *in_RDI;
  Blip_Buffer *local_20;
  
  Multi_Buffer::Multi_Buffer(in_RDI,2);
  in_RDI->_vptr_Multi_Buffer = (_func_int **)&PTR__Stereo_Buffer_00a0fe78;
  local_20 = (Blip_Buffer *)(in_RDI + 1);
  do {
    Blip_Buffer::Blip_Buffer(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (Blip_Buffer *)(in_RDI + 7));
  in_RDI[7]._vptr_Multi_Buffer = (_func_int **)(in_RDI + 1);
  *(Multi_Buffer **)&in_RDI[7].channels_changed_count_ = in_RDI + 3;
  in_RDI[7].sample_rate_ = (long)(in_RDI + 5);
  return;
}

Assistant:

Stereo_Buffer::Stereo_Buffer() : Multi_Buffer( 2 )
{
	chan.center = &bufs [0];
	chan.left = &bufs [1];
	chan.right = &bufs [2];
}